

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

void __thiscall
ON_SubDComponentIdList::AddIdList(ON_SubDComponentIdList *this,ON_SubDComponentIdList *list)

{
  uint uVar1;
  uint i;
  ulong uVar2;
  ON_SubDComponentId local_30;
  
  uVar1 = (list->m_id_list).m_count;
  this->m_bSorted = false;
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    local_30 = (list->m_id_list).m_a[uVar2];
    ON_SimpleArray<ON_SubDComponentId>::Append(&this->m_id_list,&local_30);
  }
  return;
}

Assistant:

void ON_SubDComponentIdList::AddIdList(const ON_SubDComponentIdList& list)
{
  const unsigned cnt{ list.UnsignedCount() };
  m_bSorted = false;
  for (unsigned i = 0; i < cnt; ++i)
  {
    m_id_list.Append(list[i]);
  }
}